

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall cbtQuantizedBvh::buildInternal(cbtQuantizedBvh *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtQuantizedBvhNode *ptr;
  cbtBvhSubtreeInfo *ptr_00;
  cbtOptimizedBvhNode *ptr_01;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  cbtQuantizedBvhNode *pcVar8;
  cbtBvhSubtreeInfo *pcVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  this->m_useQuantization = true;
  iVar7 = (this->m_quantizedLeafNodes).m_size;
  uVar6 = (this->m_quantizedContiguousNodes).m_size;
  iVar11 = iVar7 * 2;
  if ((int)uVar6 < iVar11) {
    lVar12 = (long)(int)uVar6;
    if ((this->m_quantizedContiguousNodes).m_capacity < iVar11) {
      if (iVar7 == 0) {
        pcVar8 = (cbtQuantizedBvhNode *)0x0;
      }
      else {
        pcVar8 = (cbtQuantizedBvhNode *)cbtAlignedAllocInternal((long)iVar7 << 5,0x10);
        uVar6 = (this->m_quantizedContiguousNodes).m_size;
      }
      if (0 < (int)uVar6) {
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar10);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar8->m_quantizedAabbMin + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)uVar6 << 4 != lVar10);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if ((ptr != (cbtQuantizedBvhNode *)0x0) &&
         ((this->m_quantizedContiguousNodes).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pcVar8;
      (this->m_quantizedContiguousNodes).m_capacity = iVar11;
    }
    lVar10 = iVar11 - lVar12;
    lVar12 = lVar12 << 4;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar12);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar12 = lVar12 + 0x10;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  (this->m_quantizedContiguousNodes).m_size = iVar11;
  this->m_curNodeIndex = 0;
  buildTree(this,0,iVar7);
  if ((this->m_useQuantization == true) && ((this->m_SubtreeHeaders).m_size == 0)) {
    iVar7 = 1;
    if ((this->m_SubtreeHeaders).m_capacity == 0) {
      pcVar9 = (cbtBvhSubtreeInfo *)cbtAlignedAllocInternal(0x20,0x10);
      lVar12 = (long)(this->m_SubtreeHeaders).m_size;
      if (0 < lVar12) {
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_SubtreeHeaders).m_data)->m_quantizedAabbMin + lVar10);
          uVar3 = puVar1[1];
          uVar4 = puVar1[2];
          uVar5 = puVar1[3];
          puVar2 = (undefined8 *)((long)pcVar9->m_quantizedAabbMin + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          puVar2[2] = uVar4;
          puVar2[3] = uVar5;
          lVar10 = lVar10 + 0x20;
        } while (lVar12 * 0x20 != lVar10);
      }
      ptr_00 = (this->m_SubtreeHeaders).m_data;
      if ((ptr_00 != (cbtBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr_00);
      }
      (this->m_SubtreeHeaders).m_ownsMemory = true;
      (this->m_SubtreeHeaders).m_data = pcVar9;
      (this->m_SubtreeHeaders).m_capacity = 1;
      iVar7 = (this->m_SubtreeHeaders).m_size + 1;
    }
    (this->m_SubtreeHeaders).m_size = iVar7;
    pcVar8 = (this->m_quantizedContiguousNodes).m_data;
    pcVar9 = (this->m_SubtreeHeaders).m_data;
    pcVar9->m_quantizedAabbMin[0] = pcVar8->m_quantizedAabbMin[0];
    pcVar9->m_quantizedAabbMin[1] = pcVar8->m_quantizedAabbMin[1];
    pcVar9->m_quantizedAabbMin[2] = pcVar8->m_quantizedAabbMin[2];
    pcVar9->m_quantizedAabbMax[0] = pcVar8->m_quantizedAabbMax[0];
    pcVar9->m_quantizedAabbMax[1] = pcVar8->m_quantizedAabbMax[1];
    pcVar9->m_quantizedAabbMax[2] = pcVar8->m_quantizedAabbMax[2];
    pcVar9->m_rootNodeIndex = 0;
    iVar7 = -pcVar8->m_escapeIndexOrTriangleIndex;
    if (-1 < pcVar8->m_escapeIndexOrTriangleIndex) {
      iVar7 = 1;
    }
    pcVar9->m_subtreeSize = iVar7;
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  pcVar8 = (this->m_quantizedLeafNodes).m_data;
  if ((pcVar8 != (cbtQuantizedBvhNode *)0x0) && ((this->m_quantizedLeafNodes).m_ownsMemory == true))
  {
    cbtAlignedFreeInternal(pcVar8);
  }
  (this->m_quantizedLeafNodes).m_ownsMemory = true;
  (this->m_quantizedLeafNodes).m_data = (cbtQuantizedBvhNode *)0x0;
  (this->m_quantizedLeafNodes).m_size = 0;
  (this->m_quantizedLeafNodes).m_capacity = 0;
  ptr_01 = (this->m_leafNodes).m_data;
  if ((ptr_01 != (cbtOptimizedBvhNode *)0x0) && ((this->m_leafNodes).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(ptr_01);
  }
  (this->m_leafNodes).m_ownsMemory = true;
  (this->m_leafNodes).m_data = (cbtOptimizedBvhNode *)0x0;
  (this->m_leafNodes).m_size = 0;
  (this->m_leafNodes).m_capacity = 0;
  return;
}

Assistant:

void cbtQuantizedBvh::buildInternal()
{
	///assumes that caller filled in the m_quantizedLeafNodes
	m_useQuantization = true;
	int numLeafNodes = 0;

	if (m_useQuantization)
	{
		//now we have an array of leafnodes in m_leafNodes
		numLeafNodes = m_quantizedLeafNodes.size();

		m_quantizedContiguousNodes.resize(2 * numLeafNodes);
	}

	m_curNodeIndex = 0;

	buildTree(0, numLeafNodes);

	///if the entire tree is small then subtree size, we need to create a header info for the tree
	if (m_useQuantization && !m_SubtreeHeaders.size())
	{
		cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(m_quantizedContiguousNodes[0]);
		subtree.m_rootNodeIndex = 0;
		subtree.m_subtreeSize = m_quantizedContiguousNodes[0].isLeafNode() ? 1 : m_quantizedContiguousNodes[0].getEscapeIndex();
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	//PCK: clear m_quantizedLeafNodes and m_leafNodes, they are temporary
	m_quantizedLeafNodes.clear();
	m_leafNodes.clear();
}